

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Generators::
Generators<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>::
populate(Generators<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
         *this,binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128> *val
        )

{
  uint64_t uVar1;
  long lVar2;
  uint64_t uVar3;
  pointer *__ptr;
  GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>
  local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
        )operator_new(0x30);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_00319870;
  uVar1 = (val->a).m_hi;
  lVar2 = *(long *)&val->b;
  uVar3 = (val->y).m_lo;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 8) = (val->a).m_lo;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 0x10) = uVar1;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar2;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 0x20) = uVar3;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 0x28) = (val->y).m_hi;
  std::
  vector<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>>
            ((vector<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,int,trng::portable_impl::uint128>>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::portable_impl::uint128,_int,_trng::portable_impl::uint128>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }